

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Player.cpp
# Opt level: O2

void __thiscall
helics::apps::Player::addMessage
          (Player *this,Time sendTime,string_view src,string_view dest,string_view payload)

{
  pointer pMVar1;
  basic_string_view<char,_std::char_traits<char>_> local_40;
  basic_string_view<char,_std::char_traits<char>_> local_30;
  
  local_40._M_str = dest._M_str;
  local_40._M_len = dest._M_len;
  local_30._M_str = src._M_str;
  local_30._M_len = src._M_len;
  CLI::std::vector<helics::apps::MessageHolder,_std::allocator<helics::apps::MessageHolder>_>::
  resize(&this->messages,
         ((long)(this->messages).
                super__Vector_base<helics::apps::MessageHolder,_std::allocator<helics::apps::MessageHolder>_>
                ._M_impl.super__Vector_impl_data._M_finish -
         (long)(this->messages).
               super__Vector_base<helics::apps::MessageHolder,_std::allocator<helics::apps::MessageHolder>_>
               ._M_impl.super__Vector_impl_data._M_start) / 0x110 + 1);
  pMVar1 = (this->messages).
           super__Vector_base<helics::apps::MessageHolder,_std::allocator<helics::apps::MessageHolder>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pMVar1[-1].sendTime.internalTimeCode = sendTime.internalTimeCode;
  SmallBuffer::operator=(&pMVar1[-1].mess.data,&payload);
  std::__cxx11::string::assign<std::basic_string_view<char,std::char_traits<char>>>
            ((string *)
             &(this->messages).
              super__Vector_base<helics::apps::MessageHolder,_std::allocator<helics::apps::MessageHolder>_>
              ._M_impl.super__Vector_impl_data._M_finish[-1].mess.source,&local_30);
  std::__cxx11::string::assign<std::basic_string_view<char,std::char_traits<char>>>
            ((string *)
             &(this->messages).
              super__Vector_base<helics::apps::MessageHolder,_std::allocator<helics::apps::MessageHolder>_>
              ._M_impl.super__Vector_impl_data._M_finish[-1].mess.dest,&local_40);
  (this->messages).
  super__Vector_base<helics::apps::MessageHolder,_std::allocator<helics::apps::MessageHolder>_>.
  _M_impl.super__Vector_impl_data._M_finish[-1].mess.time.internalTimeCode =
       sendTime.internalTimeCode;
  return;
}

Assistant:

void Player::addMessage(Time sendTime,
                        std::string_view src,
                        std::string_view dest,
                        std::string_view payload)
{
    messages.resize(messages.size() + 1);
    messages.back().sendTime = sendTime;
    messages.back().mess.data = payload;
    messages.back().mess.source = src;
    messages.back().mess.dest = dest;
    messages.back().mess.time = sendTime;
}